

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall Chainstate::ResetBlockFailureFlags(Chainstate *this,CBlockIndex *pindex)

{
  long lVar1;
  bool bVar2;
  type *this_00;
  CBlockIndex *pCVar3;
  CBlockIndex *in_RSI;
  CBlockIndex *in_RDI;
  long in_FS_OFFSET;
  type *block_index;
  type *_;
  BlockMap *__range1;
  int nHeight;
  iterator __end1;
  iterator __begin1;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  uint uVar4;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff58;
  BlockStatus in_stack_ffffffffffffff5c;
  CBlockIndex *local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),(char *)in_RDI,
             in_stack_ffffffffffffff4c,(AnnotatedMixin<std::recursive_mutex> *)0x7de30f);
  std::
  unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
  ::begin((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
           *)in_RDI);
  std::
  unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
  ::end((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
         *)in_RDI);
  while (bVar2 = std::__detail::operator==
                           ((_Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                            (_Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> *)
                            in_RDI), local_40 = in_RSI, ((bVar2 ^ 0xffU) & 1) != 0) {
    std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>::operator*
              ((_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    std::get<0ul,uint256_const,CBlockIndex>
              ((pair<const_uint256,_CBlockIndex> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    this_00 = std::get<1ul,uint256_const,CBlockIndex>
                        ((pair<const_uint256,_CBlockIndex> *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    bVar2 = CBlockIndex::IsValid(this_00,in_stack_ffffffffffffff5c);
    if ((!bVar2) &&
       (pCVar3 = CBlockIndex::GetAncestor
                           ((CBlockIndex *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                            (int)((ulong)in_RDI >> 0x20)), pCVar3 == in_RSI)) {
      this_00->nStatus = this_00->nStatus & 0xffffff9f;
      std::set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>::insert
                ((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_> *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),(value_type *)in_RDI)
      ;
      bVar2 = CBlockIndex::IsValid(this_00,in_stack_ffffffffffffff5c);
      uVar4 = in_stack_ffffffffffffff4c & 0xffffff;
      uVar5 = uVar4;
      if (bVar2) {
        bVar2 = CBlockIndex::HaveNumChainTxs
                          ((CBlockIndex *)
                           (CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48) &
                           0xffffffffffffff));
        uVar5 = uVar4 & 0xffffff;
        if (bVar2) {
          std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
          value_comp((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                      *)(CONCAT44(uVar4,in_stack_ffffffffffffff48) & 0xffffffffffffff));
          CChain::Tip((CChain *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          bVar2 = ::node::CBlockIndexWorkComparator::operator()
                            ((CBlockIndexWorkComparator *)this_00,
                             (CBlockIndex *)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),in_RDI);
          uVar5 = CONCAT13(bVar2,(int3)uVar5);
        }
      }
      in_stack_ffffffffffffff4c = uVar5;
      if ((char)(in_stack_ffffffffffffff4c >> 0x18) != '\0') {
        std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
        insert((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),(value_type *)in_RDI
              );
      }
      if (this_00 == *(CBlockIndex **)(in_RDI->m_chain_tx_count + 0x18)) {
        *(undefined8 *)(in_RDI->m_chain_tx_count + 0x18) = 0;
      }
      std::set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>::erase
                ((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_> *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),(key_type *)in_RDI);
    }
    std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>::operator++
              ((_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  for (; local_40 != (CBlockIndex *)0x0; local_40 = local_40->pprev) {
    if ((local_40->nStatus & 0x60) != 0) {
      local_40->nStatus = local_40->nStatus & 0xffffff9f;
      std::set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>::insert
                ((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_> *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),(value_type *)in_RDI)
      ;
      std::set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>::erase
                ((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_> *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),(key_type *)in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Chainstate::ResetBlockFailureFlags(CBlockIndex *pindex) {
    AssertLockHeld(cs_main);

    int nHeight = pindex->nHeight;

    // Remove the invalidity flag from this block and all its descendants.
    for (auto& [_, block_index] : m_blockman.m_block_index) {
        if (!block_index.IsValid() && block_index.GetAncestor(nHeight) == pindex) {
            block_index.nStatus &= ~BLOCK_FAILED_MASK;
            m_blockman.m_dirty_blockindex.insert(&block_index);
            if (block_index.IsValid(BLOCK_VALID_TRANSACTIONS) && block_index.HaveNumChainTxs() && setBlockIndexCandidates.value_comp()(m_chain.Tip(), &block_index)) {
                setBlockIndexCandidates.insert(&block_index);
            }
            if (&block_index == m_chainman.m_best_invalid) {
                // Reset invalid block marker if it was pointing to one of those.
                m_chainman.m_best_invalid = nullptr;
            }
            m_chainman.m_failed_blocks.erase(&block_index);
        }
    }

    // Remove the invalidity flag from all ancestors too.
    while (pindex != nullptr) {
        if (pindex->nStatus & BLOCK_FAILED_MASK) {
            pindex->nStatus &= ~BLOCK_FAILED_MASK;
            m_blockman.m_dirty_blockindex.insert(pindex);
            m_chainman.m_failed_blocks.erase(pindex);
        }
        pindex = pindex->pprev;
    }
}